

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

DynamicType * __thiscall Js::DynamicObject::DuplicateType(DynamicObject *this)

{
  Recycler *pRVar1;
  DynamicType *this_00;
  DynamicType *type;
  TrackAllocData local_38;
  DynamicObject *local_10;
  DynamicObject *this_local;
  
  local_10 = this;
  pRVar1 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&DynamicType::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
             ,0x21d);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this_00 = (DynamicType *)new<Memory::Recycler>(0x38,pRVar1,0x43c4b0);
  type = GetDynamicType(this);
  DynamicType::DynamicType(this_00,type);
  return this_00;
}

Assistant:

DynamicType* DynamicObject::DuplicateType()
    {
        return RecyclerNew(GetRecycler(), DynamicType, this->GetDynamicType());
    }